

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenBreak(BinaryenModuleRef module,char *name,BinaryenExpressionRef condition,
             BinaryenExpressionRef value)

{
  Break *pBVar1;
  string_view local_40;
  Builder local_30;
  BinaryenExpressionRef local_28;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef condition_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  local_28 = value;
  value_local = condition;
  condition_local = (BinaryenExpressionRef)name;
  name_local = (char *)module;
  wasm::Builder::Builder(&local_30,module);
  wasm::Name::Name((Name *)&local_40,(char *)condition_local);
  pBVar1 = wasm::Builder::makeBreak(&local_30,(Name)local_40,local_28,value_local);
  return (BinaryenExpressionRef)pBVar1;
}

Assistant:

BinaryenExpressionRef BinaryenBreak(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenExpressionRef condition,
                                    BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBreak(name, (Expression*)value, (Expression*)condition));
}